

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  boolean bVar2;
  size_t local_50;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  uint numtoread;
  uint i;
  JOCTET b [14];
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar1->next_input_byte;
  local_50 = pjVar1->bytes_in_buffer;
  if (local_50 == 0) {
    bVar2 = (*pjVar1->fill_input_buffer)(cinfo);
    if (bVar2 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar1->next_input_byte;
    local_50 = pjVar1->bytes_in_buffer;
  }
  local_50 = local_50 - 1;
  b._6_8_ = (ulong)*(byte *)bytes_in_buffer << 8;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_50 == 0) {
    bVar2 = (*pjVar1->fill_input_buffer)(cinfo);
    if (bVar2 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar1->next_input_byte;
    local_50 = pjVar1->bytes_in_buffer;
  }
  b._6_8_ = (ulong)*(byte *)bytes_in_buffer + b._6_8_ + -2;
  if ((long)b._6_8_ < 0xe) {
    if ((long)b._6_8_ < 1) {
      datasrc._0_4_ = 0;
    }
    else {
      datasrc._0_4_ = (uint)b._6_8_;
    }
  }
  else {
    datasrc._0_4_ = 0xe;
  }
  datasrc._4_4_ = 0;
  do {
    bytes_in_buffer = bytes_in_buffer + 1;
    local_50 = local_50 - 1;
    if ((uint)datasrc <= datasrc._4_4_) {
      b._6_8_ = b._6_8_ - (ulong)(uint)datasrc;
      if (cinfo->unread_marker == 0xe0) {
        examine_app0(cinfo,(JOCTET *)((long)&numtoread + 2),(uint)datasrc,b._6_8_);
      }
      else if (cinfo->unread_marker == 0xee) {
        examine_app14(cinfo,(JOCTET *)((long)&numtoread + 2),(uint)datasrc,b._6_8_);
      }
      else {
        cinfo->err->msg_code = 0x46;
        (cinfo->err->msg_parm).i[0] = cinfo->unread_marker;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pjVar1->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar1->bytes_in_buffer = local_50;
      if (0 < (long)b._6_8_) {
        (*cinfo->src->skip_input_data)(cinfo,b._6_8_);
      }
      return 1;
    }
    if (local_50 == 0) {
      bVar2 = (*pjVar1->fill_input_buffer)(cinfo);
      if (bVar2 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar1->next_input_byte;
      local_50 = pjVar1->bytes_in_buffer;
    }
    *(undefined1 *)((long)&numtoread + (ulong)datasrc._4_4_ + 2) = *(undefined1 *)bytes_in_buffer;
    datasrc._4_4_ = datasrc._4_4_ + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
get_interesting_appn (j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  INT32 length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int) length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}